

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O1

DenomInfo * __thiscall
duckdb::CardinalityEstimator::GetDenominator
          (DenomInfo *__return_storage_ptr__,CardinalityEstimator *this,JoinRelationSet *set)

{
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  double dVar5;
  Subgraph2Denominator left;
  Subgraph2Denominator left_00;
  Subgraph2Denominator right;
  Subgraph2Denominator right_00;
  Subgraph2Denominator right_01;
  Subgraph2Denominator right_02;
  pointer puVar6;
  DenomInfo *pDVar7;
  int iVar8;
  JoinRelationSet *pJVar9;
  Subgraph2Denominator *pSVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  pointer pSVar12;
  Subgraph2Denominator *pSVar13;
  optional_ptr<duckdb::JoinRelationSet,_true> *this_00;
  _Prime_rehash_policy *this_01;
  size_t *this_02;
  CardinalityEstimator *pCVar14;
  CardinalityEstimator *edge;
  long lVar15;
  bool bVar16;
  Subgraph2Denominator right_subgraph;
  vector<duckdb::Subgraph2Denominator,_true> subgraphs;
  vector<unsigned_long,_true> subgraph_connections;
  vector<duckdb::FilterInfoWithTotalDomains,_true> edges;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  unused_edge_tdoms;
  Subgraph2Denominator local_168;
  vector<duckdb::Subgraph2Denominator,_true> local_148;
  vector<unsigned_long,_true> local_128;
  JoinRelationSet *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  DenomInfo *local_f8;
  string local_f0;
  size_t local_d0;
  size_t sStack_c8;
  undefined8 local_c0;
  size_t local_b8;
  size_t sStack_b0;
  undefined8 local_a8;
  vector<duckdb::FilterInfoWithTotalDomains,_true> local_a0;
  string local_88;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_148.
  super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  _M_impl.super__Vector_impl_data._M_start = (Subgraph2Denominator *)0x0;
  local_148.
  super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Subgraph2Denominator *)0x0;
  local_148.
  super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Subgraph2Denominator *)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_110 = set;
  GetEdges(&local_a0,&this->relations_to_tdoms,set);
  local_f8 = __return_storage_ptr__;
  if (local_a0.
      super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      .
      super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a0.
      super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      .
      super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_108 = (CardinalityEstimator *)&this->set_manager;
    edge = (CardinalityEstimator *)
           local_a0.
           super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
           .
           super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar12 = local_148.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = (long)local_148.
                     super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     .
                     super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_148.
                     super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     .
                     super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar15 == 0x18) {
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                  (&(local_148.
                     super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     .
                     super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     ._M_impl.super__Vector_impl_data._M_start)->relations);
        JoinRelationSet::ToString_abi_cxx11_(&local_f0,(pSVar12->relations).ptr);
        JoinRelationSet::ToString_abi_cxx11_(&local_88,local_110);
        if (local_f0._M_string_length != local_88._M_string_length) goto LAB_00d1ce3a;
        if (local_f0._M_string_length == 0) {
          bVar16 = true;
        }
        else {
          iVar8 = bcmp(local_f0._M_dataplus._M_p,local_88._M_dataplus._M_p,local_f0._M_string_length
                      );
          bVar16 = iVar8 == 0;
        }
      }
      else {
LAB_00d1ce3a:
        bVar16 = false;
      }
      if (lVar15 == 0x18) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
      }
      if (bVar16) {
        if (*(char *)&(edge->relation_set_2_cardinality)._M_h._M_buckets == '\x01') {
          local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_68;
          ::std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                     &(edge->relations_to_tdoms).
                      super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                      .
                      super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                      ._M_impl.super__Vector_impl_data._M_finish,&local_128);
        }
      }
      else {
        SubgraphsConnectedByEdge(&local_128,(FilterInfoWithTotalDomains *)edge,&local_148);
        pSVar12 = local_148.
                  super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                  .
                  super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_168.relations.ptr = (JoinRelationSet *)0x0;
          local_168.numerator_relations.ptr = (JoinRelationSet *)0x0;
          local_168.denom = 1.0;
          optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          local_168.relations.ptr =
               *(JoinRelationSet **)
                ((long)&((edge->relations_to_tdoms).
                         super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         .
                         super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x20);
          optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          local_168.numerator_relations.ptr =
               *(JoinRelationSet **)
                ((long)&((edge->relations_to_tdoms).
                         super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         .
                         super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x20);
          optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          sVar2 = *(size_t *)
                   ((long)&((edge->relations_to_tdoms).
                            super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                            .
                            super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                            ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x28)
          ;
          optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          sVar3 = *(size_t *)
                   ((long)&((edge->relations_to_tdoms).
                            super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                            .
                            super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                            ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x28)
          ;
          local_a8 = 0x3ff0000000000000;
          left.numerator_relations.ptr = local_168.numerator_relations.ptr;
          left.relations.ptr = local_168.relations.ptr;
          left.denom = local_168.denom;
          right_01.numerator_relations.ptr = (JoinRelationSet *)sVar3;
          right_01.relations.ptr = (JoinRelationSet *)sVar2;
          right_01.denom = 1.0;
          local_b8 = sVar2;
          sStack_b0 = sVar3;
          local_168.numerator_relations.ptr =
               UpdateNumeratorRelations(this,left,right_01,(FilterInfoWithTotalDomains *)edge);
          pCVar14 = edge;
          optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          local_168.relations.ptr =
               *(JoinRelationSet **)
                ((long)&((edge->relations_to_tdoms).
                         super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         .
                         super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 8);
          local_c0 = 0x3ff0000000000000;
          left_00.numerator_relations.ptr = local_168.numerator_relations.ptr;
          left_00.relations.ptr = local_168.relations.ptr;
          left_00.denom = local_168.denom;
          right_02.numerator_relations.ptr = (JoinRelationSet *)sVar3;
          right_02.relations.ptr = (JoinRelationSet *)sVar2;
          right_02.denom = 1.0;
          local_d0 = sVar2;
          sStack_c8 = sVar3;
          local_168.denom =
               CalculateUpdatedDenom(pCVar14,left_00,right_02,(FilterInfoWithTotalDomains *)edge);
          if (local_148.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_148.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::Subgraph2Denominator,std::allocator<duckdb::Subgraph2Denominator>>
            ::_M_realloc_insert<duckdb::Subgraph2Denominator_const&>
                      ((vector<duckdb::Subgraph2Denominator,std::allocator<duckdb::Subgraph2Denominator>>
                        *)&local_148,
                       (iterator)
                       local_148.
                       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                       .
                       super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_168);
          }
          else {
            (local_148.
             super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             .
             super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             ._M_impl.super__Vector_impl_data._M_finish)->denom = local_168.denom;
            ((local_148.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_finish)->relations).ptr = local_168.relations.ptr;
            ((local_148.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_finish)->numerator_relations).ptr =
                 local_168.numerator_relations.ptr;
            local_148.
            super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
            .
            super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_148.
                 super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 .
                 super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          lVar15 = (long)local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          if (lVar15 == 2) {
            _Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<idx_t> *)
                  local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            _Var11._M_head_impl =
                 (unsigned_long *)
                 (((long)local_148.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         .
                         super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_148.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         .
                         super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
            if (_Var11._M_head_impl <
                (ulong)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl ||
                (long)_Var11._M_head_impl -
                (long)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl == 0) {
              ::std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
                         _Var11._M_head_impl);
            }
            puVar4 = *(unsigned_long **)
                      ((long)local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + 8);
            if (_Var11._M_head_impl < puVar4 || (long)_Var11._M_head_impl - (long)puVar4 == 0) {
              ::std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,puVar4,_Var11._M_head_impl);
            }
            pSVar13 = local_148.
                      super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      .
                      super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      (long)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar13->relations);
            pSVar10 = pSVar12 + (long)puVar4;
            pJVar9 = (pSVar13->relations).ptr;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar10->relations);
            pJVar9 = JoinRelationSetManager::Union
                               ((JoinRelationSetManager *)local_108,pJVar9,(pSVar10->relations).ptr)
            ;
            (pSVar13->relations).ptr = pJVar9;
            pCVar14 = this;
            pJVar9 = UpdateNumeratorRelations
                               (this,*pSVar13,*pSVar10,(FilterInfoWithTotalDomains *)edge);
            (pSVar13->numerator_relations).ptr = pJVar9;
            dVar5 = CalculateUpdatedDenom
                              (pCVar14,*pSVar13,*pSVar10,(FilterInfoWithTotalDomains *)edge);
            pSVar13->denom = dVar5;
            (pSVar10->relations).ptr = (JoinRelationSet *)0x0;
            lVar15 = ((long)local_148.
                            super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            .
                            super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_148.
                            super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            .
                            super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 >>
                     2;
            pSVar12 = local_148.
                      super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      .
                      super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (0 < lVar15) {
              pSVar12 = local_148.
                        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        .
                        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar15 * 4;
              lVar15 = lVar15 + 1;
              pSVar10 = local_148.
                        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        .
                        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ._M_impl.super__Vector_impl_data._M_start + 2;
              do {
                if (pSVar10[-2].relations.ptr == (JoinRelationSet *)0x0) {
                  pSVar10 = pSVar10 + -2;
                  goto LAB_00d1d3f8;
                }
                if (pSVar10[-1].relations.ptr == (JoinRelationSet *)0x0) {
                  pSVar10 = pSVar10 + -1;
                  goto LAB_00d1d3f8;
                }
                if ((pSVar10->relations).ptr == (JoinRelationSet *)0x0) goto LAB_00d1d3f8;
                if (pSVar10[1].relations.ptr == (JoinRelationSet *)0x0) {
                  pSVar10 = pSVar10 + 1;
                  goto LAB_00d1d3f8;
                }
                lVar15 = lVar15 + -1;
                pSVar10 = pSVar10 + 4;
              } while (1 < lVar15);
            }
            lVar15 = ((long)local_148.
                            super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            .
                            super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar12 >> 3) *
                     -0x5555555555555555;
            if (lVar15 == 1) {
LAB_00d1d3c3:
              pSVar10 = pSVar12;
              if ((pSVar12->relations).ptr != (JoinRelationSet *)0x0) {
                pSVar10 = local_148.
                          super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                          .
                          super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            else if (lVar15 == 2) {
LAB_00d1d3b9:
              pSVar10 = pSVar12;
              if ((pSVar12->relations).ptr != (JoinRelationSet *)0x0) {
                pSVar12 = pSVar12 + 1;
                goto LAB_00d1d3c3;
              }
            }
            else {
              pSVar10 = local_148.
                        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        .
                        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((lVar15 == 3) &&
                 (pSVar10 = pSVar12, (pSVar12->relations).ptr != (JoinRelationSet *)0x0)) {
                pSVar12 = pSVar12 + 1;
                goto LAB_00d1d3b9;
              }
            }
LAB_00d1d3f8:
            pSVar13 = pSVar10 + 1;
            if (pSVar13 !=
                local_148.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_finish &&
                pSVar10 !=
                local_148.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                if ((pSVar13->relations).ptr != (JoinRelationSet *)0x0) {
                  pSVar10->denom = pSVar13->denom;
                  pJVar9 = (pSVar13->numerator_relations).ptr;
                  (pSVar10->relations).ptr = (pSVar13->relations).ptr;
                  (pSVar10->numerator_relations).ptr = pJVar9;
                  pSVar10 = pSVar10 + 1;
                }
                pSVar13 = pSVar13 + 1;
              } while (pSVar13 !=
                       local_148.
                       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                       .
                       super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            if ((pSVar10 !=
                 local_148.
                 super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 .
                 super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               (local_148.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_finish != pSVar10)) {
              local_148.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_finish = pSVar10;
            }
          }
          else if (lVar15 == 1) {
            _Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<idx_t> *)
                  local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            _Var11._M_head_impl =
                 (unsigned_long *)
                 (((long)local_148.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         .
                         super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_148.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         .
                         super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
            if (_Var11._M_head_impl <
                (ulong)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl ||
                (long)_Var11._M_head_impl -
                (long)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl == 0) {
              ::std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
            }
            local_168.relations.ptr = (JoinRelationSet *)0x0;
            local_168.numerator_relations.ptr = (JoinRelationSet *)0x0;
            local_168.denom = 1.0;
            optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                      ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
            local_168.relations.ptr =
                 *(JoinRelationSet **)
                  ((long)&((edge->relations_to_tdoms).
                           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                           .
                           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                           ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x28);
            optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                      ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
            pSVar10 = pSVar12 + (long)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>.
                                      _M_head_impl;
            local_168.numerator_relations.ptr =
                 *(JoinRelationSet **)
                  ((long)&((edge->relations_to_tdoms).
                           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                           .
                           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                           ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x28);
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar10->relations);
            pJVar9 = (pSVar10->relations).ptr;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&local_168.relations);
            bVar16 = JoinRelationSet::IsSubset(pJVar9,local_168.relations.ptr);
            if (bVar16) {
              optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                        ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
              local_168.relations.ptr =
                   *(JoinRelationSet **)
                    ((long)&((edge->relations_to_tdoms).
                             super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                             .
                             super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                             ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x20
                    );
              optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                        ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
              local_168.numerator_relations.ptr =
                   *(JoinRelationSet **)
                    ((long)&((edge->relations_to_tdoms).
                             super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                             .
                             super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                             ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x20
                    );
            }
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar10->relations);
            pJVar9 = (pSVar10->relations).ptr;
            optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                      ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
            this_01 = (_Prime_rehash_policy *)
                      ((long)&((edge->relations_to_tdoms).
                               super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                               .
                               super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                               ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations +
                      0x20);
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                      ((optional_ptr<duckdb::JoinRelationSet,_true> *)this_01);
            bVar16 = JoinRelationSet::IsSubset
                               (pJVar9,*(JoinRelationSet **)&this_01->_M_max_load_factor);
            if (bVar16) {
              optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar10->relations);
              pJVar9 = (pSVar10->relations).ptr;
              optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                        ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
              this_02 = (size_t *)
                        ((long)&((edge->relations_to_tdoms).
                                 super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                                 .
                                 super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations +
                        0x28);
              optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                        ((optional_ptr<duckdb::JoinRelationSet,_true> *)this_02);
              bVar16 = JoinRelationSet::IsSubset(pJVar9,(JoinRelationSet *)*this_02);
              if (bVar16) goto LAB_00d1d454;
            }
            right.numerator_relations.ptr = local_168.numerator_relations.ptr;
            right.relations.ptr = local_168.relations.ptr;
            right.denom = local_168.denom;
            pJVar9 = UpdateNumeratorRelations
                               (this,*pSVar10,right,(FilterInfoWithTotalDomains *)edge);
            (pSVar10->numerator_relations).ptr = pJVar9;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar10->relations);
            pJVar9 = (pSVar10->relations).ptr;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&local_168.relations);
            pCVar14 = local_108;
            pJVar9 = JoinRelationSetManager::Union
                               ((JoinRelationSetManager *)local_108,pJVar9,local_168.relations.ptr);
            (pSVar10->relations).ptr = pJVar9;
            right_00.numerator_relations.ptr = local_168.numerator_relations.ptr;
            right_00.relations.ptr = local_168.relations.ptr;
            right_00.denom = local_168.denom;
            dVar5 = CalculateUpdatedDenom
                              (pCVar14,*pSVar10,right_00,(FilterInfoWithTotalDomains *)edge);
            pSVar10->denom = dVar5;
          }
        }
LAB_00d1d454:
        if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start !=
            (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)0x0) {
          operator_delete(local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      edge = (CardinalityEstimator *)&(edge->relation_set_2_cardinality)._M_h._M_bucket_count;
    } while (edge != (CardinalityEstimator *)
                     local_a0.
                     super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                     .
                     super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_108 = (CardinalityEstimator *)local_68._M_element_count;
  uStack_100 = 0;
  if (1 < (ulong)(((long)local_148.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         .
                         super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_148.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         .
                         super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(local_148.
                   super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   .
                   super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ._M_impl.super__Vector_impl_data._M_start)->denom;
    local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((local_148.
                    super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    .
                    super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    ._M_impl.super__Vector_impl_data._M_start)->relations).ptr;
    local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((local_148.
                    super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    .
                    super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    ._M_impl.super__Vector_impl_data._M_start)->numerator_relations).ptr;
    pSVar10 = local_148.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
    if (pSVar10 !=
        local_148.
        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                  ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_128);
        puVar6 = local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar10->relations);
        local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)JoinRelationSetManager::Union
                                (&this->set_manager,(JoinRelationSet *)puVar6,
                                 (pSVar10->relations).ptr);
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                  ((optional_ptr<duckdb::JoinRelationSet,_true> *)
                   &local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        puVar6 = local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar10->numerator_relations);
        local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)JoinRelationSetManager::Union
                                (&this->set_manager,(JoinRelationSet *)puVar6,
                                 (pSVar10->numerator_relations).ptr);
        local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(pSVar10->denom *
                      (double)local_128.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pSVar10 = pSVar10 + 1;
      } while (pSVar10 !=
               local_148.
               super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               .
               super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  dVar5 = 1.0;
  if ((local_148.
       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
       super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_148.
       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
       super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((local_148.
        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
        ._M_impl.super__Vector_impl_data._M_start)->denom != 0.0 ||
      (dVar5 = 1.0,
      NAN((local_148.
           super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
           .
           super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
           ._M_impl.super__Vector_impl_data._M_start)->denom))))) {
    this_00 = &(local_148.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_start)->numerator_relations;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(this_00);
    if (local_148.
        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_148.
        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      ::std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    local_110 = this_00->ptr;
    dVar5 = (((double)CONCAT44(0x45300000,local_108._4_4_) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(undefined4)local_108) - 4503599627370496.0) + 1.0) *
            (local_148.
             super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             .
             super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             ._M_impl.super__Vector_impl_data._M_start)->denom;
  }
  pDVar7 = local_f8;
  local_f8->numerator_relations = local_110;
  local_f8->filter_strength = 1.0;
  local_f8->denominator = dVar5;
  if ((CardinalityEstimator *)
      local_a0.
      super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      .
      super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      ._M_impl.super__Vector_impl_data._M_start != (CardinalityEstimator *)0x0) {
    operator_delete(local_a0.
                    super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                    .
                    super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  if (local_148.
      super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
      super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
      ._M_impl.super__Vector_impl_data._M_start != (Subgraph2Denominator *)0x0) {
    operator_delete(local_148.
                    super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    .
                    super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return pDVar7;
}

Assistant:

DenomInfo CardinalityEstimator::GetDenominator(JoinRelationSet &set) {
	vector<Subgraph2Denominator> subgraphs;

	// Finding the denominator is tricky. You need to go through the tdoms in decreasing order
	// Then loop through all filters in the equivalence set of the tdom to see if both the
	// left and right relations are in the new set, if so you can use that filter.
	// You must also make sure that the filters all relations in the given set, so we use subgraphs
	// that should eventually merge into one connected graph that joins all the relations
	// TODO: Implement a method to cache subgraphs so you don't have to build them up every
	// time the cardinality of a new set is requested

	// relations_to_tdoms has already been sorted by largest to smallest total domain
	// then we look through the filters for the relations_to_tdoms,
	// and we start to choose the filters that join relations in the set.

	// edges are guaranteed to be in order of largest tdom to smallest tdom.
	unordered_set<idx_t> unused_edge_tdoms;
	auto edges = GetEdges(relations_to_tdoms, set);
	for (auto &edge : edges) {
		if (subgraphs.size() == 1 && subgraphs.at(0).relations->ToString() == set.ToString()) {
			// the first subgraph has connected all the desired relations, just skip the rest of the edges
			if (edge.has_tdom_hll) {
				unused_edge_tdoms.insert(edge.tdom_hll);
			}
			continue;
		}

		auto subgraph_connections = SubgraphsConnectedByEdge(edge, subgraphs);
		if (subgraph_connections.empty()) {
			// create a subgraph out of left and right, then merge right into left and add left to subgraphs.
			// this helps cover a case where there are no subgraphs yet, and the only join filter is a SEMI JOIN
			auto left_subgraph = Subgraph2Denominator();
			auto right_subgraph = Subgraph2Denominator();
			left_subgraph.relations = edge.filter_info->left_set;
			left_subgraph.numerator_relations = edge.filter_info->left_set;
			right_subgraph.relations = edge.filter_info->right_set;
			right_subgraph.numerator_relations = edge.filter_info->right_set;
			left_subgraph.numerator_relations = &UpdateNumeratorRelations(left_subgraph, right_subgraph, edge);
			left_subgraph.relations = edge.filter_info->set.get();
			left_subgraph.denom = CalculateUpdatedDenom(left_subgraph, right_subgraph, edge);
			subgraphs.push_back(left_subgraph);
		} else if (subgraph_connections.size() == 1) {
			auto left_subgraph = &subgraphs.at(subgraph_connections.at(0));
			auto right_subgraph = Subgraph2Denominator();
			right_subgraph.relations = edge.filter_info->right_set;
			right_subgraph.numerator_relations = edge.filter_info->right_set;
			if (JoinRelationSet::IsSubset(*left_subgraph->relations, *right_subgraph.relations)) {
				right_subgraph.relations = edge.filter_info->left_set;
				right_subgraph.numerator_relations = edge.filter_info->left_set;
			}

			if (JoinRelationSet::IsSubset(*left_subgraph->relations, *edge.filter_info->left_set) &&
			    JoinRelationSet::IsSubset(*left_subgraph->relations, *edge.filter_info->right_set)) {
				// here we have an edge that connects the same subgraph to the same subgraph. Just continue. no need to
				// update the denom
				continue;
			}
			left_subgraph->numerator_relations = &UpdateNumeratorRelations(*left_subgraph, right_subgraph, edge);
			left_subgraph->relations = &set_manager.Union(*left_subgraph->relations, *right_subgraph.relations);
			left_subgraph->denom = CalculateUpdatedDenom(*left_subgraph, right_subgraph, edge);
		} else if (subgraph_connections.size() == 2) {
			// The two subgraphs in the subgraph_connections can be merged by this edge.
			D_ASSERT(subgraph_connections.at(0) < subgraph_connections.at(1));
			auto subgraph_to_merge_into = &subgraphs.at(subgraph_connections.at(0));
			auto subgraph_to_delete = &subgraphs.at(subgraph_connections.at(1));
			subgraph_to_merge_into->relations =
			    &set_manager.Union(*subgraph_to_merge_into->relations, *subgraph_to_delete->relations);
			subgraph_to_merge_into->numerator_relations =
			    &UpdateNumeratorRelations(*subgraph_to_merge_into, *subgraph_to_delete, edge);
			subgraph_to_merge_into->denom = CalculateUpdatedDenom(*subgraph_to_merge_into, *subgraph_to_delete, edge);
			subgraph_to_delete->relations = nullptr;
			auto remove_start = std::remove_if(subgraphs.begin(), subgraphs.end(),
			                                   [](Subgraph2Denominator &s) { return !s.relations; });
			subgraphs.erase(remove_start, subgraphs.end());
		}
	}

	// Slight penalty to cardinality for unused edges
	auto denom_multiplier = 1.0 + static_cast<double>(unused_edge_tdoms.size());

	// It's possible cross-products were added and are not present in the filters in the relation_2_tdom
	// structures. When that's the case, merge all remaining subgraphs.
	if (subgraphs.size() > 1) {
		auto final_subgraph = subgraphs.at(0);
		for (auto merge_with = subgraphs.begin() + 1; merge_with != subgraphs.end(); merge_with++) {
			D_ASSERT(final_subgraph.relations && merge_with->relations);
			final_subgraph.relations = &set_manager.Union(*final_subgraph.relations, *merge_with->relations);
			D_ASSERT(final_subgraph.numerator_relations && merge_with->numerator_relations);
			final_subgraph.numerator_relations =
			    &set_manager.Union(*final_subgraph.numerator_relations, *merge_with->numerator_relations);
			final_subgraph.denom *= merge_with->denom;
		}
	}
	// can happen if a table has cardinality 0, a tdom is set to 0, or if a cross product is used.
	if (subgraphs.empty() || subgraphs.at(0).denom == 0) {
		// denominator is 1 and numerators are a cross product of cardinalities.
		return DenomInfo(set, 1, 1);
	}
	return DenomInfo(*subgraphs.at(0).numerator_relations, 1, subgraphs.at(0).denom * denom_multiplier);
}